

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.h
# Opt level: O2

void __thiscall
KDIS::PDU::Environmental_Process_PDU::SetEnvironmentType
          (Environmental_Process_PDU *this,EnvironmentType *ET)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  
  KVar1 = ET->m_ui8Domain;
  KVar2 = ET->m_ui16Class;
  KVar3 = ET->m_ui8Category;
  KVar4 = ET->m_ui8SubCategory;
  KVar5 = ET->m_ui8Specific;
  KVar6 = ET->m_ui8Extra;
  (this->m_EnvType).m_ui8EntityKind = ET->m_ui8EntityKind;
  (this->m_EnvType).m_ui8Domain = KVar1;
  (this->m_EnvType).m_ui16Class = KVar2;
  (this->m_EnvType).m_ui8Category = KVar3;
  (this->m_EnvType).m_ui8SubCategory = KVar4;
  (this->m_EnvType).m_ui8Specific = KVar5;
  (this->m_EnvType).m_ui8Extra = KVar6;
  return;
}

Assistant:

class KDIS_EXPORT EnvironmentType : public DataTypeBase
{
protected:

    KUINT8 m_ui8EntityKind; // This value should allways be Environmental(4)

    KUINT8 m_ui8Domain;

    KUINT16 m_ui16Class;

    KUINT8 m_ui8Category;

    KUINT8 m_ui8SubCategory;

    KUINT8 m_ui8Specific;

    KUINT8 m_ui8Extra;

public:

    static const KUINT16 ENVIROMENT_TYPE_SIZE = 8;

    EnvironmentType();

    EnvironmentType( KUINT8 Kind, KDIS::DATA_TYPE::ENUMS::EntityDomain Domain, KUINT16 Class, KUINT8 Categoy,
                     KDIS::DATA_TYPE::ENUMS::EnvironmentSubcategory SubCategory, KUINT8 Specific, KUINT8 Extra );

    EnvironmentType( KDIS::DATA_TYPE::ENUMS::EntityDomain Domain, KUINT16 Class, KUINT8 Categoy,
                     KDIS::DATA_TYPE::ENUMS::EnvironmentSubcategory SubCategory, KUINT8 Specific, KUINT8 Extra );

    EnvironmentType(KDataStream &stream) noexcept(false);

    virtual ~EnvironmentType();

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateType::SetKind
    //              KDIS::DATA_TYPE::AggregateType::GetKind
    // Description: Kind. This values should be 4 according to the EBV document however
    //              some DIS application do use other values for custom types.
    // Parameter:   KUINT8 UI, void
    //************************************
    void SetKind( KUINT8 K );
    KUINT8 GetKind() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EnvironmentType::SetDomain
    //              KDIS::DATA_TYPE::EnvironmentType::GetDomain
    // Description: Domain
    // Parameter:   EntityDomain  UI, void
    //************************************
    void SetDomain( KDIS::DATA_TYPE::ENUMS::EntityDomain UI );
    KDIS::DATA_TYPE::ENUMS::EntityDomain GetDomain() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EnvironmentType::SetClass
    //              KDIS::DATA_TYPE::EnvironmentType::GetClass
    // Description: Class
    // Parameter:   KUINT16 CL, void
    //************************************
    void SetClass( KUINT16 UI );
    KUINT16 GetClass() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EnvironmentType::SetCategory
    //              KDIS::DATA_TYPE::EnvironmentType::GetCategory
    // Description: Category
    // Parameter:   KUINT8 UI, void
    //************************************
    void SetCategory( KUINT8 UI );
    KUINT8 GetCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EnvironmentType::SetSubCategory
    //              KDIS::DATA_TYPE::EnvironmentType::GetSubCategory
    // Description: Sub Category
    // Parameter:   EnvironmentSubcategory UI, void
    //************************************
    void SetSubCategory( KDIS::DATA_TYPE::ENUMS::EnvironmentSubcategory UI );
    KDIS::DATA_TYPE::ENUMS::EnvironmentSubcategory GetSubCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EnvironmentType::SetSpecific
    //              KDIS::DATA_TYPE::EnvironmentType::GetSpecific
    // Description: Specific
    // Parameter:   KUINT8 UI, void
    //************************************
    void SetSpecific( KUINT8 UI );
    KUINT8 GetSpecific() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EnvironmentType::SetExtra
    //              KDIS::DATA_TYPE::EnvironmentType::GetExtra
    // Description: Extra
    // Parameter:   KUINT8  UI, void
    //************************************
    void SetExtra( KUINT8 UI );
    KUINT8 GetExtra() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EnvironmentType::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EnvironmentType::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::EnvironmentType::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const EnvironmentType & Value ) const;
    KBOOL operator != ( const EnvironmentType & Value ) const;
    KBOOL operator  < ( const EnvironmentType & Value ) const;
}